

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConeRecord1.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::ConeRecord1::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,ConeRecord1 *this)

{
  ostream *poVar1;
  KStringStream ss;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  EnvironmentRecord::GetAsString_abi_cxx11_(&local_1c0,&this->super_EnvironmentRecord);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\tVertex Location: ");
  WorldCoordinates::GetAsString_abi_cxx11_(&local_1e0,&this->m_Loc);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"\tOrientation:     ");
  EulerAngles::GetAsString_abi_cxx11_(&local_200,&this->m_Ori);
  poVar1 = std::operator<<(poVar1,(string *)&local_200);
  poVar1 = std::operator<<(poVar1,"\tHeight:          ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32Height);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tPeak Angle:      ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32PeakAngle);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString ConeRecord1::GetAsString() const
{
    KStringStream ss;

    ss << EnvironmentRecord::GetAsString()
       << "\tVertex Location: " << m_Loc.GetAsString()
       << "\tOrientation:     " << m_Ori.GetAsString()
       << "\tHeight:          " << m_f32Height         << "\n"
       << "\tPeak Angle:      " << m_f32PeakAngle      << "\n";

    return ss.str();
}